

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pw91_lda_rpa.hpp
# Opt level: O2

void ExchCXX::kernel_traits<ExchCXX::BuiltinPW91_LDA_RPA>::eval_exc_unpolar_impl
               (double rho,double *eps)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  dVar1 = cbrt(rho);
  dVar3 = (1.0 / dVar1) * 1.720508027656199;
  dVar5 = (1.0 / dVar1) * 2.4814019635975995;
  dVar4 = SQRT(dVar5);
  dVar1 = dVar4;
  if (dVar5 < 0.0) {
    dVar1 = sqrt(dVar5);
  }
  if (dVar5 < 0.0) {
    dVar4 = sqrt(dVar5);
  }
  dVar4 = dVar4 * dVar4 * dVar4;
  dVar5 = dVar5 * 0.25;
  dVar2 = pow(dVar5,1.75);
  dVar2 = log((32.16364864430221 /
              (dVar4 * 0.02955875 + dVar3 * 2.3772599667377015 * 0.25 + dVar1 * 5.1486 * 0.5 +
              dVar2 * 0.20614)) * 0.5 + 1.0);
  dVar2 = (dVar3 * 0.11895241781024411 * 0.25 + 1.0) * 0.031091 * dVar2;
  dVar1 = log((59.217149286433354 /
              (dVar4 * 0.0599875 + dVar3 * 5.225414418180771 * 0.25 + dVar1 * 10.357 * 0.5 +
              dVar5 * dVar5 * 0.12279)) * 0.5 + 1.0);
  dVar1 = (dVar3 * 0.04157861286239228 * 0.25 + 1.0) * 0.0 * dVar1 * 0.5848223397455204;
  *eps = (dVar1 + dVar1) - (dVar2 + dVar2);
  return;
}

Assistant:

BUILTIN_KERNEL_EVAL_RETURN
    eval_exc_unpolar_impl( double rho, double& eps ) {

    (void)(eps);
    constexpr double t3 = constants::m_cbrt_3;
    constexpr double t6 = constants::m_cbrt_one_ov_pi;
    constexpr double t7 = constants::m_cbrt_4;
    constexpr double t52 = constants::m_cbrt_2;
    constexpr double t1 = a_0;
    constexpr double t2 = alpha1_0;
    constexpr double t4 = t2 * t3;
    constexpr double t8 = t7 * t7;
    constexpr double t9 = t6 * t8;
    constexpr double t17 = 0.1e1 / t1;
    constexpr double t18 = beta1_0;
    constexpr double t19 = t3 * t6;
    constexpr double t26 = beta2_0 * t3;
    constexpr double t29 = beta3_0;
    constexpr double t36 = pp_0 + 0.1e1;
    constexpr double t57 = a_2;
    constexpr double t59 = alpha1_2;
    constexpr double t60 = t59 * t3;
    constexpr double t64 = 0.1e1 / t57;
    constexpr double t65 = beta1_2;
    constexpr double t69 = beta2_2 * t3;
    constexpr double t72 = beta3_2;
    constexpr double t77 = pp_2 + 0.1e1;
    constexpr double t87 = 0.1e1 / fz20;


    const double t10 = safe_math::cbrt( rho );
    const double t11 = 0.1e1 / t10;
    const double t12 = t9 * t11;
    const double t15 = 0.1e1 + t4 * t12 / 0.4e1;
    const double t21 = t19 * t8 * t11;
    const double t22 = safe_math::sqrt( t21 );
    const double t30 = pow_3_2( t21 );
    const double t34 = t21 / 0.4e1;
    const double t37 = safe_math::pow( t34, t36 );
    const double t38 = beta4_0 * t37;
    const double t39 = t18 * t22 / 0.2e1 + t26 * t12 / 0.4e1 + 0.125e0 * t29 * t30 + t38;
    const double t43 = 0.1e1 + t17 / t39 / 0.2e1;
    const double t44 = safe_math::log( t43 );
    const double t45 = t1 * t15 * t44;
    const double t47 = safe_math::cbrt( zeta_tol );
    const double t49 = piecewise_functor_3( 0.1e1 <= zeta_tol, t47 * zeta_tol, 1.0 );
    const double t56 = ( 0.2e1 * t49 - 0.2e1 ) / ( 0.2e1 * t52 - 0.2e1 );
    const double t63 = 0.1e1 + t60 * t12 / 0.4e1;
    const double t78 = safe_math::pow( t34, t77 );
    const double t79 = beta4_2 * t78;
    const double t80 = t65 * t22 / 0.2e1 + t69 * t12 / 0.4e1 + 0.125e0 * t72 * t30 + t79;
    const double t84 = 0.1e1 + t64 / t80 / 0.2e1;
    const double t85 = safe_math::log( t84 );
    const double t89 = t56 * t57 * t63 * t85 * t87;


    eps = -0.2e1 * t45 + 0.2e1 * t89;

  }